

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_stack.c
# Opt level: O0

control_frame * pop_control_stack(control_frame *__return_storage_ptr__,control_stack *s)

{
  control_stack *s_local;
  
  s->sp = s->sp + -1;
  s->size = s->size - 1;
  if (s->sp < s->bp) {
    fprintf(_stderr,"control_stack overflow\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/tool/stack/control_stack.c"
                  ,0x3c,"control_frame pop_control_stack(control_stack *)");
  }
  memcpy(__return_storage_ptr__,s->sp,0x48);
  return __return_storage_ptr__;
}

Assistant:

control_frame pop_control_stack(control_stack *s) {
    s->sp -= 1;
    s->size--;
    if (s->sp < s->bp) {
        errorExit("control_stack overflow\n");
    } else {
        return *s->sp;
    }
}